

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopInvariantCodeMotion.cpp
# Opt level: O3

bool __thiscall
wasm::LoopInvariantCodeMotion::hasGetDependingOnLoopSet
          (LoopInvariantCodeMotion *this,Expression *curr,LoopSets *loopSets)

{
  bool bVar1;
  const_iterator cVar2;
  LocalSet **ppLVar3;
  undefined1 auVar4 [8];
  undefined1 local_a0 [8];
  FindAll<wasm::LocalGet> gets;
  Iterator ret_1;
  LocalSet *set;
  undefined1 local_50 [8];
  Iterator __begin3;
  
  FindAll<wasm::LocalGet>::FindAll((FindAll<wasm::LocalGet> *)local_a0,curr);
  if (local_a0 ==
      (undefined1  [8])
      gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    bVar1 = false;
  }
  else {
    auVar4 = local_a0;
    do {
      gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)LazyLocalGraph::getSets(this->localGraph,*(LocalGet **)auVar4);
      ret_1.parent._0_1_ =
           (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
              *)gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)->flexible)._M_t._M_impl.
           super__Rb_tree_header._M_node_count == 0;
      __begin3.fixedIndex = 0;
      local_50 = (undefined1  [8])
                 gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      __begin3.parent._0_1_ = ret_1.parent._0_1_;
      if ((bool)ret_1.parent._0_1_) {
        __begin3.usingFixed = false;
        __begin3._9_7_ = 0;
        ret_1.fixedIndex = 0;
        ret_1._8_8_ = (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                         *)&((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                              *)gets.list.
                                super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->fixed)->fixed).
                      super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
      }
      else {
        __begin3.fixedIndex =
             (size_t)(((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                        *)gets.list.
                          super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage)->flexible)._M_t._M_impl
                     .super__Rb_tree_header._M_header._M_left;
        ret_1.fixedIndex =
             (size_t)&(((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                         *)gets.list.
                           super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage)->flexible)._M_t.
                      _M_impl.super__Rb_tree_header;
      }
      while (bVar1 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                     ::
                     IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                     ::operator==((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                                   *)local_50,
                                  (Iterator *)
                                  &gets.list.
                                   super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar1) {
        ppLVar3 = (LocalSet **)(__begin3.fixedIndex + 0x20);
        if ((byte)__begin3.parent != 0) {
          ppLVar3 = (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                       *)local_50)->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage.
                    _M_elems + __begin3._8_8_;
        }
        ret_1.flexibleIterator._M_node = (_Base_ptr)*ppLVar3;
        if ((ret_1.flexibleIterator._M_node != (_Base_ptr)0x0) &&
           (cVar2 = std::
                    _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::find(&loopSets->_M_h,(key_type *)&ret_1.flexibleIterator),
           cVar2.super__Node_iterator_base<wasm::LocalSet_*,_false>._M_cur != (__node_type *)0x0))
        goto LAB_00946315;
        if (((byte)__begin3.parent & 1) == 0) {
          __begin3.fixedIndex = std::_Rb_tree_increment((_Rb_tree_node_base *)__begin3.fixedIndex);
        }
        else {
          __begin3._8_8_ = __begin3._8_8_ + 1;
        }
      }
      auVar4 = (undefined1  [8])((long)auVar4 + 8);
    } while (auVar4 != (undefined1  [8])
                       gets.list.
                       super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                       _M_impl.super__Vector_impl_data._M_start);
LAB_00946315:
    bVar1 = !bVar1;
  }
  if (local_a0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_a0,
                    (long)gets.list.
                          super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_a0);
  }
  return bVar1;
}

Assistant:

bool hasGetDependingOnLoopSet(Expression* curr, LoopSets& loopSets) {
    FindAll<LocalGet> gets(curr);
    for (auto* get : gets.list) {
      auto& sets = localGraph->getSets(get);
      for (auto* set : sets) {
        // nullptr means a parameter or zero-init value;
        // no danger to us.
        if (!set) {
          continue;
        }
        // Check if the set is in the loop. If not, it's either before,
        // which is fine, or after, which is also fine - moving curr
        // to just outside the loop will preserve those relationships.
        // TODO: this still counts curr's sets as inside the loop, which
        //       might matter in non-flat mode.
        if (loopSets.count(set)) {
          return true;
        }
      }
    }
    return false;
  }